

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_unittest.h
# Opt level: O1

bool __thiscall
google::protobuf::internal::WriteMessage<proto2_unittest::OneString>
          (internal *this,string_view value,OneString *message,string *wire_buffer)

{
  Arena *arena;
  MessageLite *this_00;
  string_view value_00;
  
  this_00 = (MessageLite *)value._M_str;
  *(byte *)&this_00[1]._vptr_MessageLite = *(byte *)&this_00[1]._vptr_MessageLite | 1;
  arena = (Arena *)(this_00->_internal_metadata_).ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  value_00._M_str = (char *)value._M_len;
  value_00._M_len = (size_t)this;
  ArenaStringPtr::Set((ArenaStringPtr *)&this_00[1]._internal_metadata_,value_00,arena);
  (message->super_Message).super_MessageLite._internal_metadata_.ptr_ = 0;
  *(undefined1 *)(message->super_Message).super_MessageLite._vptr_MessageLite = 0;
  MessageLite::AppendToString(this_00,(string *)message);
  return (message->super_Message).super_MessageLite._internal_metadata_.ptr_ != 0;
}

Assistant:

bool WriteMessage(absl::string_view value, T* message,
                  std::string* wire_buffer) {
  message->set_data(value);
  wire_buffer->clear();
  message->AppendToString(wire_buffer);
  return (!wire_buffer->empty());
}